

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void libtorrent::aux::anon_unknown_135::pick_busy_blocks
               (piece_picker *picker,piece_index_t piece,int blocks_in_piece,int timed_out,
               vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               *interesting_blocks,downloading_piece *pi)

{
  block_info *info;
  busy_block_t *pbVar1;
  block_info *pbVar2;
  int iVar3;
  long lVar4;
  busy_block_t *pbVar5;
  uint uVar6;
  int iVar7;
  busy_block_t *pbVar8;
  ulong uVar9;
  busy_block_t *block;
  busy_block_t *__i;
  span<const_libtorrent::aux::piece_picker::block_info> sVar10;
  undefined1 local_48 [8];
  alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t> busy_blocks_destructor;
  piece_index_t piece_local;
  
  pbVar5 = (busy_block_t *)local_48;
  pbVar8 = (busy_block_t *)(long)blocks_in_piece;
  busy_blocks_destructor.objects.m_len._4_4_ = piece.m_val;
  if (blocks_in_piece < 0x201) {
    if (blocks_in_piece < 1) {
      pbVar8 = (busy_block_t *)0x0;
      pbVar1 = (busy_block_t *)0x0;
    }
    else {
      pbVar5 = (busy_block_t *)
               (local_48 + -((ulong)(uint)blocks_in_piece * 8 + 0xf & 0xfffffffffffffff0));
      pbVar1 = pbVar5;
    }
  }
  else {
    pbVar1 = (busy_block_t *)operator_new__((long)pbVar8 * 8);
    pbVar5 = (busy_block_t *)local_48;
  }
  local_48 = (undefined1  [8])pbVar1;
  busy_blocks_destructor.objects.m_ptr = pbVar8;
  pbVar5[-1].peers = 0x2e89f2;
  pbVar5[-1].index = 0;
  sVar10 = piece_picker::blocks_for_piece(picker,pi);
  pbVar2 = sVar10.m_ptr;
  iVar3 = 0;
  iVar7 = 0;
  for (lVar4 = sVar10.m_len << 4; uVar9 = (ulong)iVar7, lVar4 != 0; lVar4 = lVar4 + -0x10) {
    if (((*(ushort *)&pbVar2->field_0x8 & 0xc000) == 0x4000) &&
       (uVar6 = *(ushort *)&pbVar2->field_0x8 & 0x3fff, (int)uVar6 <= timed_out)) {
      pbVar1[uVar9].peers = uVar6;
      pbVar1[uVar9].index = iVar3;
      iVar7 = iVar7 + 1;
    }
    pbVar2 = pbVar2 + 1;
    iVar3 = iVar3 + 1;
  }
  if (iVar7 != 0) {
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    pbVar5[-1].peers = 0x2e8a5d;
    pbVar5[-1].index = 0;
    ::std::
    __introsort_loop<libtorrent::aux::(anonymous_namespace)::busy_block_t*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar1,pbVar1 + uVar9,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if (iVar7 < 0x11) {
      pbVar5[-1].peers = 0x2e8a9f;
      pbVar5[-1].index = 0;
      ::std::
      __insertion_sort<libtorrent::aux::(anonymous_namespace)::busy_block_t*,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar1,pbVar1 + uVar9);
    }
    else {
      pbVar8 = pbVar1 + 0x10;
      pbVar5[-1].peers = 0x2e8a75;
      pbVar5[-1].index = 0;
      ::std::
      __insertion_sort<libtorrent::aux::(anonymous_namespace)::busy_block_t*,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar1,pbVar8);
      for (lVar4 = uVar9 * 8 + -0x80; lVar4 != 0; lVar4 = lVar4 + -8) {
        pbVar5[-1].peers = 0x2e8a8a;
        pbVar5[-1].index = 0;
        ::std::
        __unguarded_linear_insert<libtorrent::aux::(anonymous_namespace)::busy_block_t*,__gnu_cxx::__ops::_Val_less_iter>
                  (pbVar8);
        pbVar8 = pbVar8 + 1;
      }
    }
  }
  for (lVar4 = uVar9 << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
    pbVar5[-1].peers = 0x2e8abb;
    pbVar5[-1].index = 0;
    ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
    emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int_const&>
              ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
               interesting_blocks,
               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ((long)&busy_blocks_destructor.objects.m_len + 4),&pbVar1->index);
    pbVar1 = pbVar1 + 1;
  }
  pbVar5[-1].peers = 0x2e8ace;
  pbVar5[-1].index = 0;
  alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t>::~alloca_destructor
            ((alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t> *)local_48);
  return;
}

Assistant:

void pick_busy_blocks(piece_picker const* picker
		, piece_index_t const piece
		, int const blocks_in_piece
		, int const timed_out
		, std::vector<piece_block>& interesting_blocks
		, piece_picker::downloading_piece const& pi)
	{
		// if there aren't any free blocks in the piece, and the piece is
		// old enough, we may switch into busy mode for this piece. In this
		// case busy_blocks and busy_count are set to contain the eligible
		// busy blocks we may pick
		// first, figure out which blocks are eligible for picking
		// in "busy-mode"
		TORRENT_ALLOCA(busy_blocks, busy_block_t, blocks_in_piece);
		int busy_count = 0;

		// pick busy blocks from the piece
		int idx = -1;
		for (auto const& info : picker->blocks_for_piece(pi))
		{
			++idx;
			// only consider blocks that have been requested
			// and we're still waiting for them
			if (info.state != piece_picker::block_info::state_requested)
				continue;

			piece_block b(piece, idx);

			// only allow a single additional request per block, in order
			// to spread it out evenly across all stalled blocks
			if (int(info.num_peers) > timed_out)
				continue;

			busy_blocks[busy_count].peers = info.num_peers;
			busy_blocks[busy_count].index = idx;
			++busy_count;

#if TORRENT_DEBUG_STREAMING > 1
			std::printf(" [%d (%d)]", b.block_index, info.num_peers);
#endif
		}
#if TORRENT_DEBUG_STREAMING > 1
		std::printf("\n");
#endif

		busy_blocks = busy_blocks.first(busy_count);

		// then sort blocks by the number of peers with requests
		// to the blocks (request the blocks with the fewest peers
		// first)
		std::sort(busy_blocks.begin(), busy_blocks.end());

		// then insert them into the interesting_blocks vector
		for (auto const& block : busy_blocks)
			interesting_blocks.emplace_back(piece, block.index);
	}